

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolutionNeighbourhood.cpp
# Opt level: O1

void __thiscall SolutionNeighbourhood::undoLastMove(SolutionNeighbourhood *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t sVar2;
  Solution *pSVar3;
  Move *pMVar4;
  pointer pcVar5;
  pointer ppTVar6;
  pointer ppTVar7;
  int iVar8;
  vector<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
  *pvVar9;
  Position *pPVar10;
  Turn *pTVar11;
  ShiftType *pSVar12;
  string *psVar13;
  string *psVar14;
  NurseSolution *pNVar15;
  NurseSolution *ns2;
  vector<Turn_*,_std::allocator<Turn_*>_> *__range2;
  pointer ppTVar16;
  pointer ppTVar17;
  Turn *pTVar18;
  Turn *unaff_R15;
  vector<Turn_*,_std::allocator<Turn_*>_> day1;
  vector<Turn_*,_std::allocator<Turn_*>_> day2;
  vector<Turn_*,_std::allocator<Turn_*>_> local_78;
  vector<Turn_*,_std::allocator<Turn_*>_> local_58;
  Turn *local_38;
  
  if (this->lastMove != (Move *)0x0) {
    local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    iVar8 = Move::getMoveType(this->lastMove);
    if (iVar8 == 0) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getLastPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&local_78,
                 (pvVar9->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar8);
      ppTVar6 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar17 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppTVar17 != ppTVar6; ppTVar17 = ppTVar17 + 1
          ) {
        pTVar11 = *ppTVar17;
        pSVar12 = Turn::getShiftType(pTVar11);
        psVar13 = ShiftType::getId_abi_cxx11_(pSVar12);
        pPVar10 = Move::getLastPosition(this->lastMove);
        pSVar12 = Position::getShiftType(pPVar10);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar12);
        sVar2 = psVar13->_M_string_length;
        if ((sVar2 == psVar14->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2), iVar8 == 0
            )))) {
          psVar13 = Turn::getSkill_abi_cxx11_(pTVar11);
          pPVar10 = Move::getLastPosition(this->lastMove);
          psVar14 = Position::getSkill_abi_cxx11_(pPVar10);
          sVar2 = psVar13->_M_string_length;
          if ((sVar2 == psVar14->_M_string_length) &&
             ((sVar2 == 0 ||
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2),
              iVar8 == 0)))) {
            pSVar3 = this->solution;
            pNVar15 = Move::getMovedNurse(this->lastMove);
            Solution::removeNurseFromTurn(pSVar3,pNVar15,pTVar11);
            break;
          }
        }
      }
    }
    else if (iVar8 == 1) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getInitialPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&local_78,
                 (pvVar9->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar8);
      ppTVar6 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar17 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start; ppTVar17 != ppTVar6; ppTVar17 = ppTVar17 + 1
          ) {
        pTVar11 = *ppTVar17;
        pSVar12 = Turn::getShiftType(pTVar11);
        psVar13 = ShiftType::getId_abi_cxx11_(pSVar12);
        pPVar10 = Move::getInitialPosition(this->lastMove);
        pSVar12 = Position::getShiftType(pPVar10);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar12);
        sVar2 = psVar13->_M_string_length;
        if ((sVar2 == psVar14->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2), iVar8 == 0
            )))) {
          psVar13 = Turn::getSkill_abi_cxx11_(pTVar11);
          pPVar10 = Move::getInitialPosition(this->lastMove);
          psVar14 = Position::getSkill_abi_cxx11_(pPVar10);
          sVar2 = psVar13->_M_string_length;
          if ((sVar2 == psVar14->_M_string_length) &&
             ((sVar2 == 0 ||
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2),
              iVar8 == 0)))) {
            pNVar15 = Move::getMovedNurse(this->lastMove);
            NurseSolution::addTurn(pNVar15,pTVar11);
            goto LAB_0011662e;
          }
        }
      }
    }
    else if (iVar8 == 2) {
      pvVar9 = Solution::getTurns(this->solution);
      pPVar10 = Move::getInitialPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&local_78,
                 (pvVar9->
                 super__Vector_base<std::vector<Turn_*,_std::allocator<Turn_*>_>,_std::allocator<std::vector<Turn_*,_std::allocator<Turn_*>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + iVar8);
      pTVar11 = (Turn *)Solution::getTurns(this->solution);
      pPVar10 = Move::getLastPosition(this->lastMove);
      iVar8 = Position::getDay(pPVar10);
      std::vector<Turn_*,_std::allocator<Turn_*>_>::operator=
                (&local_58,
                 (vector<Turn_*,_std::allocator<Turn_*>_> *)((long)iVar8 * 0x18 + *(long *)pTVar11))
      ;
      ppTVar6 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppTVar17 = local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start;
          ppTVar7 = local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                    super__Vector_impl_data._M_finish,
          ppTVar16 = local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                     super__Vector_impl_data._M_start, local_38 = pTVar11, ppTVar17 != ppTVar6;
          ppTVar17 = ppTVar17 + 1) {
        unaff_R15 = *ppTVar17;
        pSVar12 = Turn::getShiftType(unaff_R15);
        psVar13 = ShiftType::getId_abi_cxx11_(pSVar12);
        pPVar10 = Move::getInitialPosition(this->lastMove);
        pSVar12 = Position::getShiftType(pPVar10);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar12);
        sVar2 = psVar13->_M_string_length;
        pTVar18 = pTVar11;
        if ((sVar2 == psVar14->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2), iVar8 == 0
            )))) {
          psVar13 = Turn::getSkill_abi_cxx11_(unaff_R15);
          pPVar10 = Move::getInitialPosition(this->lastMove);
          psVar14 = Position::getSkill_abi_cxx11_(pPVar10);
          sVar2 = psVar13->_M_string_length;
          if ((sVar2 == psVar14->_M_string_length) &&
             ((pTVar18 = unaff_R15, sVar2 != 0 &&
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2),
              pTVar18 = pTVar11, iVar8 == 0)))) {
            pTVar18 = unaff_R15;
          }
        }
        pTVar11 = pTVar18;
      }
      for (; ppTVar16 != ppTVar7; ppTVar16 = ppTVar16 + 1) {
        pTVar11 = *ppTVar16;
        pSVar12 = Turn::getShiftType(pTVar11);
        psVar13 = ShiftType::getId_abi_cxx11_(pSVar12);
        pPVar10 = Move::getLastPosition(this->lastMove);
        pSVar12 = Position::getShiftType(pPVar10);
        psVar14 = ShiftType::getId_abi_cxx11_(pSVar12);
        sVar2 = psVar13->_M_string_length;
        pTVar18 = unaff_R15;
        if ((sVar2 == psVar14->_M_string_length) &&
           ((sVar2 == 0 ||
            (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2), iVar8 == 0
            )))) {
          psVar13 = Turn::getSkill_abi_cxx11_(pTVar11);
          pPVar10 = Move::getLastPosition(this->lastMove);
          psVar14 = Position::getSkill_abi_cxx11_(pPVar10);
          sVar2 = psVar13->_M_string_length;
          if ((sVar2 == psVar14->_M_string_length) &&
             ((pTVar18 = pTVar11, sVar2 != 0 &&
              (iVar8 = bcmp((psVar13->_M_dataplus)._M_p,(psVar14->_M_dataplus)._M_p,sVar2),
              pTVar18 = unaff_R15, iVar8 == 0)))) {
            pTVar18 = pTVar11;
          }
        }
        unaff_R15 = pTVar18;
      }
      pSVar3 = this->solution;
      pNVar15 = Move::getMovedNurse(this->lastMove);
      ns2 = Move::getTradedNurse(this->lastMove);
      Solution::atomicSwitchNurseTurns(pSVar3,pNVar15,unaff_R15,ns2,local_38);
      pMVar4 = this->lastMove;
      if (pMVar4 != (Move *)0x0) {
        pcVar5 = (pMVar4->lastPosition).skill._M_dataplus._M_p;
        paVar1 = &(pMVar4->lastPosition).skill.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
        pcVar5 = (pMVar4->initialPosition).skill._M_dataplus._M_p;
        paVar1 = &(pMVar4->initialPosition).skill.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 != paVar1) {
          operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
        }
        operator_delete(pMVar4,0x70);
      }
      this->lastMove = (Move *)0x0;
    }
    pMVar4 = this->lastMove;
    if (pMVar4 != (Move *)0x0) {
      pcVar5 = (pMVar4->lastPosition).skill._M_dataplus._M_p;
      paVar1 = &(pMVar4->lastPosition).skill.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != paVar1) {
        operator_delete(pcVar5,paVar1->_M_allocated_capacity + 1);
      }
      pcVar5 = (pMVar4->initialPosition).skill._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar5 != &(pMVar4->initialPosition).skill.field_2) {
        operator_delete(pcVar5,(pMVar4->initialPosition).skill.field_2._M_allocated_capacity + 1);
      }
      operator_delete(pMVar4,0x70);
    }
    this->lastMove = (Move *)0x0;
LAB_0011662e:
    if (local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<Turn_*,_std::allocator<Turn_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void SolutionNeighbourhood::undoLastMove(){
    if(lastMove == nullptr)
        return;
    vector<Turn*> day1 , day2;
    switch (lastMove->getMoveType())
    {
        case 0:
            //insert so we have to remove
            day1 = solution->getTurns()[lastMove->getLastPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill()) {
                    solution->removeNurseFromTurn(lastMove->getMovedNurse(),turn);
                    delete lastMove;
                    lastMove = nullptr;
                    return;
                }
            }
            break;
        case 1:
            //remove so we have to insert
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill()){
                    lastMove->getMovedNurse()->addTurn(turn);
                return;
                }
            }
            break;
        case 2:
            //trade so we have to do the inverse, so 2 to 1, and 1 to 2
            day1 = solution->getTurns()[lastMove->getInitialPosition().getDay()];
            day2 = solution->getTurns()[lastMove->getLastPosition().getDay()];

            Turn* initialTurn;
            Turn* lastTurn;

            for(Turn* turn : day1)
            {
                if(turn->getShiftType()->getId() == lastMove->getInitialPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getInitialPosition().getSkill())
                    initialTurn = turn;
            }
            for(Turn* turn : day2)
            {
                if(turn->getShiftType()->getId() == lastMove->getLastPosition().getShiftType()->getId() && turn->getSkill() == lastMove->getLastPosition().getSkill())
                    lastTurn = turn;
            }

            //atomicSwitchNurseTurns, invert what lastMove did
            //NS1 / LastPosition / NS2 / InitialPosition
            solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn);
            //if(!solution->atomicSwitchNurseTurns(lastMove->getMovedNurse(),lastTurn,lastMove->getTradedNurse(),initialTurn))
                //cout << "ERRO" << endl;
            delete lastMove;
            lastMove = nullptr;
            break;
    }

    delete lastMove;
    lastMove = nullptr;
}